

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtimer.cpp
# Opt level: O1

void testTimerRoutine(void)

{
  int *piVar1;
  element_type *peVar2;
  int iVar3;
  Timer *pTVar4;
  long lVar5;
  int *piVar6;
  undefined1 local_130 [8];
  TimerRoutine routine;
  milliseconds local_48;
  undefined1 local_40 [8];
  Ptr timer;
  
  hwnet::util::TimerRoutine::TimerRoutine((TimerRoutine *)local_130,1);
  timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x64;
  pTVar4 = (Timer *)operator_new(0x78);
  lVar5 = std::chrono::_V2::steady_clock::now();
  local_48 = (long)&(timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base +
             (lVar5 - routine._168_8_) / 1000000;
  routine.waitting = false;
  routine._193_7_ = 0;
  routine._192_8_ = operator_new(2);
  hwnet::util::Timer::Timer
            (pTVar4,&local_48,
             (milliseconds *)
             &timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             false,(Callback *)&routine.waitting);
  std::__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::util::Timer,void>
            ((__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> *)local_40,pTVar4);
  std::
  _Function_handler<void_(const_std::shared_ptr<hwnet::util::Timer>_&),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/testtimer.cpp:18:23)_(std::_Placeholder<1>)>_>
  ::_M_manager((_Any_data *)&routine.waitting,(_Any_data *)&routine.waitting,__destroy_functor);
  piVar6 = &routine.mgr.policy;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)piVar6);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  hwnet::util::TimerMgr::insert((TimerMgr *)local_130,(Ptr *)local_40);
  if (((char)routine.waitTime == '\x01') &&
     (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      (ulong)routine.begTime.__d.__r)) {
    routine.begTime.__d.__r =
         (duration)
         (duration)
         timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    std::_V2::condition_variable_any::notify_one
              ((condition_variable_any *)
               &routine.mgr.elements.
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  peVar2 = timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)&((timer.
                                super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_enable_shared_from_this<hwnet::util::Timer>).
                              _M_weak_this.
                              super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    else {
      piVar1 = (int *)((long)&((timer.
                                super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_enable_shared_from_this<hwnet::util::Timer>).
                              _M_weak_this.
                              super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)piVar6);
  if (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (peVar2 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)&(peVar2->super_enable_shared_from_this<hwnet::util::Timer>).
                              _M_weak_this.
                              super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4);
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = *(int *)((long)&(peVar2->super_enable_shared_from_this<hwnet::util::Timer>).
                              _M_weak_this.
                              super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4);
      *(int *)((long)&(peVar2->super_enable_shared_from_this<hwnet::util::Timer>)._M_weak_this.
                      super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi + 4) = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (**(code **)((long)&(((peVar2->super_enable_shared_from_this<hwnet::util::Timer>)._M_weak_this
                            .super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->mCallback).super__Function_base._M_functor + 8))(peVar2);
    }
  }
  timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc8;
  pTVar4 = (Timer *)operator_new(0x78);
  lVar5 = std::chrono::_V2::steady_clock::now();
  local_48 = (long)&(timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base +
             (lVar5 - routine._168_8_) / 1000000;
  routine.waitting = false;
  routine._193_7_ = 0;
  routine._192_8_ = operator_new(2);
  hwnet::util::Timer::Timer
            (pTVar4,&local_48,
             (milliseconds *)
             &timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             false,(Callback *)&routine.waitting);
  std::__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::util::Timer,void>
            ((__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> *)local_40,pTVar4);
  std::
  _Function_handler<void_(const_std::shared_ptr<hwnet::util::Timer>_&),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/testtimer.cpp:22:23)_(std::_Placeholder<1>)>_>
  ::_M_manager((_Any_data *)&routine.waitting,(_Any_data *)&routine.waitting,__destroy_functor);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)piVar6);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  hwnet::util::TimerMgr::insert((TimerMgr *)local_130,(Ptr *)local_40);
  if (((char)routine.waitTime == '\x01') &&
     (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      (ulong)routine.begTime.__d.__r)) {
    routine.begTime.__d.__r =
         (duration)
         (duration)
         timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    std::_V2::condition_variable_any::notify_one
              ((condition_variable_any *)
               &routine.mgr.elements.
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  peVar2 = timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)&((timer.
                                super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_enable_shared_from_this<hwnet::util::Timer>).
                              _M_weak_this.
                              super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    else {
      piVar1 = (int *)((long)&((timer.
                                super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_enable_shared_from_this<hwnet::util::Timer>).
                              _M_weak_this.
                              super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)piVar6);
  if (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (peVar2 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar6 = (int *)((long)&(peVar2->super_enable_shared_from_this<hwnet::util::Timer>).
                              _M_weak_this.
                              super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4);
      iVar3 = *piVar6;
      *piVar6 = *piVar6 + -1;
      UNLOCK();
    }
    else {
      iVar3 = *(int *)((long)&(peVar2->super_enable_shared_from_this<hwnet::util::Timer>).
                              _M_weak_this.
                              super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4);
      *(int *)((long)&(peVar2->super_enable_shared_from_this<hwnet::util::Timer>)._M_weak_this.
                      super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi + 4) = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (**(code **)((long)&(((peVar2->super_enable_shared_from_this<hwnet::util::Timer>)._M_weak_this
                            .super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->mCallback).super__Function_base._M_functor + 8))(peVar2);
    }
  }
  routine.waitting = true;
  routine._193_7_ = 0;
  do {
    iVar3 = nanosleep((timespec *)&routine.waitting,(timespec *)&routine.waitting);
    if (iVar3 != -1) break;
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  hwnet::util::TimerRoutine::~TimerRoutine((TimerRoutine *)local_130);
  return;
}

Assistant:

void testTimerRoutine() {
	hwnet::util::TimerRoutine routine(hwnet::util::TimerMgr::normal);


	routine.addTimer(100,[](const hwnet::util::Timer::Ptr & t){
		std::cout << "timer 100" << std::endl;
	});

	routine.addTimer(200,[](const hwnet::util::Timer::Ptr & t){
		std::cout << "timer 200" << std::endl;
	});	

	std::this_thread::sleep_for(std::chrono::seconds(1));

}